

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O2

void __thiscall
helics::apps::SineGenerator::set(SineGenerator *this,string_view parameter,double val)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  
  __y._M_str = "frequency";
  __y._M_len = 9;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y);
  if (((!bVar1) &&
      (__y_00._M_str = "freq", __y_00._M_len = 4,
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_00),
      !bVar1)) &&
     (__y_01._M_str = "f", __y_01._M_len = 1,
     bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_01),
     !bVar1)) {
    __y_02._M_str = "period";
    __y_02._M_len = 6;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_02);
    if (!bVar1) {
      __y_03._M_str = "dfdt";
      __y_03._M_len = 4;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_03);
      if (bVar1) {
        this->dfdt = val;
        return;
      }
      __y_04._M_str = "dadt";
      __y_04._M_len = 4;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_04);
      if (bVar1) {
        this->dAdt = val;
        return;
      }
      __y_05._M_str = "amplitude";
      __y_05._M_len = 9;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_05);
      if (((bVar1) ||
          (__y_06._M_str = "amp", __y_06._M_len = 3,
          bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_06
                                 ), bVar1)) ||
         (__y_07._M_str = "a", __y_07._M_len = 1,
         bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_07)
         , bVar1)) {
        this->amplitude = val;
        return;
      }
      __y_08._M_str = "level";
      __y_08._M_len = 5;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_08);
      if (bVar1) {
        this->level = val;
        return;
      }
      __y_09._M_str = "offset";
      __y_09._M_len = 6;
      bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)parameter,__y_09);
      if (bVar1) {
        this->offset = val;
        return;
      }
      SignalGenerator::set(&this->super_SignalGenerator,(string_view)parameter,val);
      return;
    }
    val = 1.0 / val;
  }
  this->frequency = val;
  return;
}

Assistant:

void SineGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "level") {
            level = val;
        } else if (parameter == "offset") {
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }